

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

Lit __thiscall Minisat::Solver::pickBranchLit(Solver *this)

{
  double *seed;
  int size;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  lbool *plVar4;
  double dVar5;
  lbool local_3a;
  lbool local_39;
  double *local_38;
  
  seed = &this->random_seed;
  dVar5 = drand(seed);
  iVar2 = -1;
  if ((dVar5 < this->random_var_freq) && (size = (this->order_heap).heap.sz, size != 0)) {
    iVar2 = irand(seed,size);
    iVar2 = Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::operator[]
                      (&this->order_heap,iVar2);
    local_39 = value(this,iVar2);
    bVar1 = lbool::operator==(&local_39,l_Undef);
    if ((bVar1) &&
       (pcVar3 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                           (&(this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>
                            ,iVar2), *pcVar3 != '\0')) {
      this->rnd_decisions = this->rnd_decisions + 1;
    }
  }
  local_38 = seed;
  do {
    if (iVar2 != -1) {
      local_3a = value(this,iVar2);
      bVar1 = lbool::operator!=(&local_3a,l_Undef);
      if ((!bVar1) &&
         (pcVar3 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                             (&(this->decision).
                               super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar2),
         *pcVar3 != '\0')) {
        plVar4 = IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>::operator[]
                           (&(this->user_pol).
                             super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>,iVar2)
        ;
        bVar1 = lbool::operator!=(plVar4,l_Undef);
        if (bVar1) {
          plVar4 = IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>::operator[]
                             (&(this->user_pol).
                               super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>,
                              iVar2);
          bVar1 = lbool::operator==(plVar4,l_True);
        }
        else {
          if (this->rnd_pol != true) {
            pcVar3 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                               (&(this->polarity).
                                 super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar2);
            return (Lit)((uint)(*pcVar3 != '\0') + iVar2 * 2);
          }
          dVar5 = drand(local_38);
          bVar1 = dVar5 < 0.5;
        }
        return (Lit)((uint)bVar1 + iVar2 * 2);
      }
    }
    if ((this->order_heap).heap.sz == 0) {
      return (Lit)-2;
    }
    iVar2 = Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::removeMin
                      (&this->order_heap);
  } while( true );
}

Assistant:

Lit Solver::pickBranchLit()
{
    Var next = var_Undef;

    // Random decision:
    if (drand(random_seed) < random_var_freq && !order_heap.empty()){
        next = order_heap[irand(random_seed,order_heap.size())];
        if (value(next) == l_Undef && decision[next])
            rnd_decisions++; }

    // Activity based decision:
    while (next == var_Undef || value(next) != l_Undef || !decision[next])
        if (order_heap.empty()){
            next = var_Undef;
            break;
        }else
            next = order_heap.removeMin();

    // Choose polarity based on different polarity modes (global or per-variable):
    if (next == var_Undef)
        return lit_Undef;
    else if (user_pol[next] != l_Undef)
        return mkLit(next, user_pol[next] == l_True);
    else if (rnd_pol)
        return mkLit(next, drand(random_seed) < 0.5);
    else
        return mkLit(next, polarity[next]);
}